

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

void __thiscall vkt::anon_unknown_0::PixelValue::setValue(PixelValue *this,size_t ndx,bool value)

{
  bool value_local;
  size_t ndx_local;
  PixelValue *this_local;
  
  this->m_status = this->m_status | (ushort)(1 << ((byte)(ndx << 1) & 0x1f));
  if (value) {
    this->m_status = this->m_status | (ushort)(1 << ((char)ndx * '\x02' + 1U & 0x1f));
  }
  else {
    this->m_status = this->m_status & ((ushort)(1 << ((char)ndx * '\x02' + 1U & 0x1f)) ^ 0xffff);
  }
  return;
}

Assistant:

void PixelValue::setValue (size_t ndx, bool value)
{
	DE_ASSERT(ndx < 4);
	DE_ASSERT(m_status <= 0xFFu);

	m_status |= (deUint16)(0x1u << (ndx * 2));

	if (value)
		m_status |= (deUint16)(0x1u << (ndx * 2 + 1));
	else
		m_status &= (deUint16)~(0x1u << (deUint16)(ndx * 2 + 1));

	DE_ASSERT(m_status <= 0xFFu);
}